

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void idct64_stage10_sse4_1
               (__m128i *u,__m128i *cospim32,__m128i *cospi32,__m128i *clamp_lo,__m128i *clamp_hi,
               __m128i *rnding,int bit)

{
  int *piVar1;
  uint *puVar2;
  __m128i alVar3;
  __m128i alVar4;
  __m128i alVar5;
  __m128i alVar6;
  __m128i alVar7;
  __m128i alVar8;
  __m128i alVar9;
  __m128i alVar10;
  __m128i alVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  longlong lVar16;
  long lVar17;
  __m128i *palVar18;
  int iVar19;
  uint uVar20;
  int iVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar29 [16];
  int iVar30;
  uint uVar31;
  int iVar33;
  uint uVar34;
  int iVar35;
  uint uVar36;
  int iVar37;
  uint uVar38;
  undefined1 auVar32 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  
  palVar18 = u;
  for (lVar17 = 0x1f0; lVar17 != 0xf0; lVar17 = lVar17 + -0x10) {
    iVar19 = (int)(*palVar18)[0];
    iVar23 = *(int *)((long)*palVar18 + 4);
    iVar25 = (int)(*palVar18)[1];
    iVar27 = *(int *)((long)*palVar18 + 0xc);
    piVar1 = (int *)((long)*u + lVar17);
    iVar30 = *piVar1 + iVar19;
    iVar33 = piVar1[1] + iVar23;
    iVar35 = piVar1[2] + iVar25;
    iVar37 = piVar1[3] + iVar27;
    iVar19 = iVar19 - *piVar1;
    iVar23 = iVar23 - piVar1[1];
    iVar25 = iVar25 - piVar1[2];
    iVar27 = iVar27 - piVar1[3];
    iVar15 = (int)(*clamp_lo)[0];
    iVar12 = *(int *)((long)*clamp_lo + 4);
    iVar13 = (int)(*clamp_lo)[1];
    iVar14 = *(int *)((long)*clamp_lo + 0xc);
    uVar31 = (uint)(iVar30 < iVar15) * iVar15 | (uint)(iVar30 >= iVar15) * iVar30;
    uVar34 = (uint)(iVar33 < iVar12) * iVar12 | (uint)(iVar33 >= iVar12) * iVar33;
    uVar36 = (uint)(iVar35 < iVar13) * iVar13 | (uint)(iVar35 >= iVar13) * iVar35;
    uVar38 = (uint)(iVar37 < iVar14) * iVar14 | (uint)(iVar37 >= iVar14) * iVar37;
    iVar30 = (int)(*clamp_hi)[0];
    iVar33 = *(int *)((long)*clamp_hi + 4);
    iVar35 = (int)(*clamp_hi)[1];
    iVar37 = *(int *)((long)*clamp_hi + 0xc);
    uVar20 = (uint)(iVar19 < iVar15) * iVar15 | (uint)(iVar19 >= iVar15) * iVar19;
    uVar24 = (uint)(iVar23 < iVar12) * iVar12 | (uint)(iVar23 >= iVar12) * iVar23;
    uVar26 = (uint)(iVar25 < iVar13) * iVar13 | (uint)(iVar25 >= iVar13) * iVar25;
    uVar28 = (uint)(iVar27 < iVar14) * iVar14 | (uint)(iVar27 >= iVar14) * iVar27;
    *(uint *)*palVar18 = (uint)(iVar30 < (int)uVar31) * iVar30 | (iVar30 >= (int)uVar31) * uVar31;
    *(uint *)((long)*palVar18 + 4) =
         (uint)(iVar33 < (int)uVar34) * iVar33 | (iVar33 >= (int)uVar34) * uVar34;
    *(uint *)(*palVar18 + 1) =
         (uint)(iVar35 < (int)uVar36) * iVar35 | (iVar35 >= (int)uVar36) * uVar36;
    *(uint *)((long)*palVar18 + 0xc) =
         (uint)(iVar37 < (int)uVar38) * iVar37 | (iVar37 >= (int)uVar38) * uVar38;
    puVar2 = (uint *)((long)*u + lVar17);
    *puVar2 = (uint)(iVar30 < (int)uVar20) * iVar30 | (iVar30 >= (int)uVar20) * uVar20;
    puVar2[1] = (uint)(iVar33 < (int)uVar24) * iVar33 | (iVar33 >= (int)uVar24) * uVar24;
    puVar2[2] = (uint)(iVar35 < (int)uVar26) * iVar35 | (iVar35 >= (int)uVar26) * uVar26;
    puVar2[3] = (uint)(iVar37 < (int)uVar28) * iVar37 | (iVar37 >= (int)uVar28) * uVar28;
    palVar18 = palVar18 + 1;
  }
  alVar3 = *cospim32;
  alVar4 = u[0x28];
  alVar5 = u[0x29];
  alVar6 = u[0x2a];
  alVar7 = u[0x2b];
  auVar21 = pmulld((undefined1  [16])alVar4,(undefined1  [16])alVar3);
  alVar8 = *cospi32;
  alVar9 = u[0x37];
  auVar32 = pmulld((undefined1  [16])alVar9,(undefined1  [16])alVar8);
  iVar19 = (int)(*rnding)[0];
  iVar23 = *(int *)((long)*rnding + 4);
  iVar25 = (int)(*rnding)[1];
  iVar27 = *(int *)((long)*rnding + 0xc);
  auVar22 = ZEXT416((uint)bit);
  auVar39 = pmulld((undefined1  [16])alVar5,(undefined1  [16])alVar3);
  alVar10 = u[0x36];
  auVar42 = pmulld((undefined1  [16])alVar10,(undefined1  [16])alVar8);
  alVar11 = u[0x35];
  auVar43._0_4_ = (int)alVar11[0] + (int)alVar6[0];
  auVar43._4_4_ = alVar11[0]._4_4_ + alVar6[0]._4_4_;
  auVar43._8_4_ = (int)alVar11[1] + (int)alVar6[1];
  auVar43._12_4_ = alVar11[1]._4_4_ + alVar6[1]._4_4_;
  auVar41 = pmulld((undefined1  [16])alVar6,(undefined1  [16])alVar3);
  auVar44 = pmulld((undefined1  [16])alVar11,(undefined1  [16])alVar8);
  auVar29 = pmulld((undefined1  [16])alVar3,(undefined1  [16])alVar7);
  alVar3 = u[0x34];
  auVar47 = pmulld((undefined1  [16])alVar3,(undefined1  [16])alVar8);
  auVar46._0_4_ = (int)alVar3[0] + (int)alVar7[0];
  auVar46._4_4_ = alVar3[0]._4_4_ + alVar7[0]._4_4_;
  auVar46._8_4_ = (int)alVar3[1] + (int)alVar7[1];
  auVar46._12_4_ = alVar3[1]._4_4_ + alVar7[1]._4_4_;
  auVar45 = pmulld(auVar46,(undefined1  [16])alVar8);
  *(int *)u[0x34] = auVar45._0_4_ + iVar19 >> auVar22;
  *(int *)((long)u[0x34] + 4) = auVar45._4_4_ + iVar23 >> auVar22;
  *(int *)(u[0x34] + 1) = auVar45._8_4_ + iVar25 >> auVar22;
  *(int *)((long)u[0x34] + 0xc) = auVar45._12_4_ + iVar27 >> auVar22;
  auVar45 = pmulld(auVar43,(undefined1  [16])*cospi32);
  iVar15 = *(int *)((long)*rnding + 4);
  lVar16 = (*rnding)[1];
  iVar12 = *(int *)((long)*rnding + 0xc);
  auVar40._0_4_ = (int)alVar10[0] + (int)alVar5[0];
  auVar40._4_4_ = alVar10[0]._4_4_ + alVar5[0]._4_4_;
  auVar40._8_4_ = (int)alVar10[1] + (int)alVar5[1];
  auVar40._12_4_ = alVar10[1]._4_4_ + alVar5[1]._4_4_;
  *(int *)u[0x35] = auVar45._0_4_ + (int)(*rnding)[0] >> auVar22;
  *(int *)((long)u[0x35] + 4) = auVar45._4_4_ + iVar15 >> auVar22;
  *(int *)(u[0x35] + 1) = auVar45._8_4_ + (int)lVar16 >> auVar22;
  *(int *)((long)u[0x35] + 0xc) = auVar45._12_4_ + iVar12 >> auVar22;
  auVar40 = pmulld(auVar40,(undefined1  [16])*cospi32);
  iVar15 = *(int *)((long)*rnding + 4);
  lVar16 = (*rnding)[1];
  iVar12 = *(int *)((long)*rnding + 0xc);
  auVar45._0_4_ = (int)alVar9[0] + (int)alVar4[0];
  auVar45._4_4_ = alVar9[0]._4_4_ + alVar4[0]._4_4_;
  auVar45._8_4_ = (int)alVar9[1] + (int)alVar4[1];
  auVar45._12_4_ = alVar9[1]._4_4_ + alVar4[1]._4_4_;
  *(int *)u[0x36] = auVar40._0_4_ + (int)(*rnding)[0] >> auVar22;
  *(int *)((long)u[0x36] + 4) = auVar40._4_4_ + iVar15 >> auVar22;
  *(int *)(u[0x36] + 1) = auVar40._8_4_ + (int)lVar16 >> auVar22;
  *(int *)((long)u[0x36] + 0xc) = auVar40._12_4_ + iVar12 >> auVar22;
  auVar45 = pmulld(auVar45,(undefined1  [16])*cospi32);
  iVar15 = *(int *)((long)*rnding + 4);
  lVar16 = (*rnding)[1];
  iVar12 = *(int *)((long)*rnding + 0xc);
  *(int *)u[0x37] = auVar45._0_4_ + (int)(*rnding)[0] >> auVar22;
  *(int *)((long)u[0x37] + 4) = auVar45._4_4_ + iVar15 >> auVar22;
  *(int *)(u[0x37] + 1) = auVar45._8_4_ + (int)lVar16 >> auVar22;
  *(int *)((long)u[0x37] + 0xc) = auVar45._12_4_ + iVar12 >> auVar22;
  *(int *)u[0x28] = auVar32._0_4_ + auVar21._0_4_ + iVar19 >> auVar22;
  *(int *)((long)u[0x28] + 4) = auVar32._4_4_ + auVar21._4_4_ + iVar23 >> auVar22;
  *(int *)(u[0x28] + 1) = auVar32._8_4_ + auVar21._8_4_ + iVar25 >> auVar22;
  *(int *)((long)u[0x28] + 0xc) = auVar32._12_4_ + auVar21._12_4_ + iVar27 >> auVar22;
  *(int *)u[0x29] = auVar39._0_4_ + iVar19 + auVar42._0_4_ >> auVar22;
  *(int *)((long)u[0x29] + 4) = auVar39._4_4_ + iVar23 + auVar42._4_4_ >> auVar22;
  *(int *)(u[0x29] + 1) = auVar39._8_4_ + iVar25 + auVar42._8_4_ >> auVar22;
  *(int *)((long)u[0x29] + 0xc) = auVar39._12_4_ + iVar27 + auVar42._12_4_ >> auVar22;
  *(int *)u[0x2a] = auVar41._0_4_ + iVar19 + auVar44._0_4_ >> auVar22;
  *(int *)((long)u[0x2a] + 4) = auVar41._4_4_ + iVar23 + auVar44._4_4_ >> auVar22;
  *(int *)(u[0x2a] + 1) = auVar41._8_4_ + iVar25 + auVar44._8_4_ >> auVar22;
  *(int *)((long)u[0x2a] + 0xc) = auVar41._12_4_ + iVar27 + auVar44._12_4_ >> auVar22;
  *(int *)u[0x2b] = auVar29._0_4_ + iVar19 + auVar47._0_4_ >> auVar22;
  *(int *)((long)u[0x2b] + 4) = auVar29._4_4_ + iVar23 + auVar47._4_4_ >> auVar22;
  *(int *)(u[0x2b] + 1) = auVar29._8_4_ + iVar25 + auVar47._8_4_ >> auVar22;
  *(int *)((long)u[0x2b] + 0xc) = auVar29._12_4_ + iVar27 + auVar47._12_4_ >> auVar22;
  alVar3 = *cospim32;
  alVar4 = u[0x2c];
  alVar5 = u[0x2d];
  alVar6 = u[0x2e];
  alVar7 = u[0x2f];
  auVar45 = pmulld((undefined1  [16])alVar4,(undefined1  [16])alVar3);
  alVar8 = *cospi32;
  alVar9 = u[0x33];
  auVar29 = pmulld((undefined1  [16])alVar9,(undefined1  [16])alVar8);
  iVar19 = (int)(*rnding)[0];
  iVar23 = *(int *)((long)*rnding + 4);
  iVar25 = (int)(*rnding)[1];
  iVar27 = *(int *)((long)*rnding + 0xc);
  auVar39 = pmulld((undefined1  [16])alVar5,(undefined1  [16])alVar3);
  alVar10 = u[0x32];
  auVar43 = pmulld((undefined1  [16])alVar10,(undefined1  [16])alVar8);
  alVar11 = u[0x31];
  auVar44._0_4_ = (int)alVar11[0] + (int)alVar6[0];
  auVar44._4_4_ = alVar11[0]._4_4_ + alVar6[0]._4_4_;
  auVar44._8_4_ = (int)alVar11[1] + (int)alVar6[1];
  auVar44._12_4_ = alVar11[1]._4_4_ + alVar6[1]._4_4_;
  auVar42 = pmulld((undefined1  [16])alVar6,(undefined1  [16])alVar3);
  auVar46 = pmulld((undefined1  [16])alVar11,(undefined1  [16])alVar8);
  auVar21 = pmulld((undefined1  [16])alVar3,(undefined1  [16])alVar7);
  alVar3 = u[0x30];
  auVar48 = pmulld((undefined1  [16])alVar3,(undefined1  [16])alVar8);
  auVar47._0_4_ = (int)alVar3[0] + (int)alVar7[0];
  auVar47._4_4_ = alVar3[0]._4_4_ + alVar7[0]._4_4_;
  auVar47._8_4_ = (int)alVar3[1] + (int)alVar7[1];
  auVar47._12_4_ = alVar3[1]._4_4_ + alVar7[1]._4_4_;
  auVar32 = pmulld(auVar47,(undefined1  [16])alVar8);
  *(int *)u[0x30] = auVar32._0_4_ + iVar19 >> auVar22;
  *(int *)((long)u[0x30] + 4) = auVar32._4_4_ + iVar23 >> auVar22;
  *(int *)(u[0x30] + 1) = auVar32._8_4_ + iVar25 >> auVar22;
  *(int *)((long)u[0x30] + 0xc) = auVar32._12_4_ + iVar27 >> auVar22;
  auVar32 = pmulld(auVar44,(undefined1  [16])*cospi32);
  iVar15 = *(int *)((long)*rnding + 4);
  lVar16 = (*rnding)[1];
  iVar12 = *(int *)((long)*rnding + 0xc);
  auVar41._0_4_ = (int)alVar10[0] + (int)alVar5[0];
  auVar41._4_4_ = alVar10[0]._4_4_ + alVar5[0]._4_4_;
  auVar41._8_4_ = (int)alVar10[1] + (int)alVar5[1];
  auVar41._12_4_ = alVar10[1]._4_4_ + alVar5[1]._4_4_;
  *(int *)u[0x31] = auVar32._0_4_ + (int)(*rnding)[0] >> auVar22;
  *(int *)((long)u[0x31] + 4) = auVar32._4_4_ + iVar15 >> auVar22;
  *(int *)(u[0x31] + 1) = auVar32._8_4_ + (int)lVar16 >> auVar22;
  *(int *)((long)u[0x31] + 0xc) = auVar32._12_4_ + iVar12 >> auVar22;
  auVar40 = pmulld(auVar41,(undefined1  [16])*cospi32);
  iVar15 = *(int *)((long)*rnding + 4);
  lVar16 = (*rnding)[1];
  iVar12 = *(int *)((long)*rnding + 0xc);
  auVar32._0_4_ = (int)alVar9[0] + (int)alVar4[0];
  auVar32._4_4_ = alVar9[0]._4_4_ + alVar4[0]._4_4_;
  auVar32._8_4_ = (int)alVar9[1] + (int)alVar4[1];
  auVar32._12_4_ = alVar9[1]._4_4_ + alVar4[1]._4_4_;
  *(int *)u[0x32] = auVar40._0_4_ + (int)(*rnding)[0] >> auVar22;
  *(int *)((long)u[0x32] + 4) = auVar40._4_4_ + iVar15 >> auVar22;
  *(int *)(u[0x32] + 1) = auVar40._8_4_ + (int)lVar16 >> auVar22;
  *(int *)((long)u[0x32] + 0xc) = auVar40._12_4_ + iVar12 >> auVar22;
  auVar32 = pmulld(auVar32,(undefined1  [16])*cospi32);
  iVar15 = *(int *)((long)*rnding + 4);
  lVar16 = (*rnding)[1];
  iVar12 = *(int *)((long)*rnding + 0xc);
  *(int *)u[0x33] = auVar32._0_4_ + (int)(*rnding)[0] >> auVar22;
  *(int *)((long)u[0x33] + 4) = auVar32._4_4_ + iVar15 >> auVar22;
  *(int *)(u[0x33] + 1) = auVar32._8_4_ + (int)lVar16 >> auVar22;
  *(int *)((long)u[0x33] + 0xc) = auVar32._12_4_ + iVar12 >> auVar22;
  *(int *)u[0x2c] = auVar29._0_4_ + auVar45._0_4_ + iVar19 >> auVar22;
  *(int *)((long)u[0x2c] + 4) = auVar29._4_4_ + auVar45._4_4_ + iVar23 >> auVar22;
  *(int *)(u[0x2c] + 1) = auVar29._8_4_ + auVar45._8_4_ + iVar25 >> auVar22;
  *(int *)((long)u[0x2c] + 0xc) = auVar29._12_4_ + auVar45._12_4_ + iVar27 >> auVar22;
  *(int *)u[0x2d] = auVar39._0_4_ + iVar19 + auVar43._0_4_ >> auVar22;
  *(int *)((long)u[0x2d] + 4) = auVar39._4_4_ + iVar23 + auVar43._4_4_ >> auVar22;
  *(int *)(u[0x2d] + 1) = auVar39._8_4_ + iVar25 + auVar43._8_4_ >> auVar22;
  *(int *)((long)u[0x2d] + 0xc) = auVar39._12_4_ + iVar27 + auVar43._12_4_ >> auVar22;
  *(int *)u[0x2e] = auVar42._0_4_ + iVar19 + auVar46._0_4_ >> auVar22;
  *(int *)((long)u[0x2e] + 4) = auVar42._4_4_ + iVar23 + auVar46._4_4_ >> auVar22;
  *(int *)(u[0x2e] + 1) = auVar42._8_4_ + iVar25 + auVar46._8_4_ >> auVar22;
  *(int *)((long)u[0x2e] + 0xc) = auVar42._12_4_ + iVar27 + auVar46._12_4_ >> auVar22;
  *(int *)u[0x2f] = auVar21._0_4_ + iVar19 + auVar48._0_4_ >> auVar22;
  *(int *)((long)u[0x2f] + 4) = auVar21._4_4_ + iVar23 + auVar48._4_4_ >> auVar22;
  *(int *)(u[0x2f] + 1) = auVar21._8_4_ + iVar25 + auVar48._8_4_ >> auVar22;
  *(int *)((long)u[0x2f] + 0xc) = auVar21._12_4_ + iVar27 + auVar48._12_4_ >> auVar22;
  return;
}

Assistant:

static inline void idct64_stage10_sse4_1(__m128i *u, const __m128i *cospim32,
                                         const __m128i *cospi32,
                                         const __m128i *clamp_lo,
                                         const __m128i *clamp_hi,
                                         const __m128i *rnding, int bit) {
  __m128i temp1, temp2, temp3, temp4;
  for (int i = 0; i < 16; i++) {
    addsub_sse4_1(u[i], u[31 - i], &u[i], &u[31 - i], clamp_lo, clamp_hi);
  }

  temp1 = half_btf_sse4_1(cospim32, &u[40], cospi32, &u[55], rnding, bit);
  temp2 = half_btf_sse4_1(cospim32, &u[41], cospi32, &u[54], rnding, bit);
  temp3 = half_btf_sse4_1(cospim32, &u[42], cospi32, &u[53], rnding, bit);
  temp4 = half_btf_sse4_1(cospim32, &u[43], cospi32, &u[52], rnding, bit);
  u[52] = half_btf_sse4_1(cospi32, &u[43], cospi32, &u[52], rnding, bit);
  u[53] = half_btf_sse4_1(cospi32, &u[42], cospi32, &u[53], rnding, bit);
  u[54] = half_btf_sse4_1(cospi32, &u[41], cospi32, &u[54], rnding, bit);
  u[55] = half_btf_sse4_1(cospi32, &u[40], cospi32, &u[55], rnding, bit);
  u[40] = temp1;
  u[41] = temp2;
  u[42] = temp3;
  u[43] = temp4;

  temp1 = half_btf_sse4_1(cospim32, &u[44], cospi32, &u[51], rnding, bit);
  temp2 = half_btf_sse4_1(cospim32, &u[45], cospi32, &u[50], rnding, bit);
  temp3 = half_btf_sse4_1(cospim32, &u[46], cospi32, &u[49], rnding, bit);
  temp4 = half_btf_sse4_1(cospim32, &u[47], cospi32, &u[48], rnding, bit);
  u[48] = half_btf_sse4_1(cospi32, &u[47], cospi32, &u[48], rnding, bit);
  u[49] = half_btf_sse4_1(cospi32, &u[46], cospi32, &u[49], rnding, bit);
  u[50] = half_btf_sse4_1(cospi32, &u[45], cospi32, &u[50], rnding, bit);
  u[51] = half_btf_sse4_1(cospi32, &u[44], cospi32, &u[51], rnding, bit);
  u[44] = temp1;
  u[45] = temp2;
  u[46] = temp3;
  u[47] = temp4;
}